

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# experiments.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  ushort uVar1;
  uint i;
  int iVar2;
  ffe_t *pfVar3;
  ffe_t fVar4;
  uint i_1;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  uint i_2;
  long lVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  ffe_t temp [15];
  undefined1 local_58 [32];
  
  iVar2 = 0;
  uVar6 = 1;
  do {
    GFExp[uVar6] = (ffe_t)iVar2;
    uVar6 = uVar6 * 2;
    if (0xffff < uVar6) {
      uVar6 = uVar6 ^ 0x1002d;
    }
    iVar2 = iVar2 + 1;
  } while (iVar2 != 0xffff);
  GFExp[0] = 0xffff;
  GFLog[0] = 0;
  uVar5 = 0;
  pfVar3 = GFLog;
  do {
    uVar1 = kGFBasis[uVar5];
    uVar9 = 1L << (uVar5 & 0x3f);
    uVar10 = uVar9 & 0xffffffff;
    if ((uint)uVar9 < 2) {
      uVar10 = 1;
    }
    lVar12 = (uVar9 & 0xffffffff) * 2;
    lVar7 = 0;
    do {
      lVar11 = lVar12 + lVar7;
      *(ushort *)((long)GFLog + lVar11) = *(ushort *)((long)GFLog + lVar7) ^ uVar1;
      lVar7 = lVar7 + 2;
    } while (uVar10 * 2 != lVar7);
    uVar5 = uVar5 + 1;
  } while (uVar5 != 0x10);
  lVar7 = 0;
  do {
    auVar19 = vpmovzxwq_avx512f(*(undefined1 (*) [16])((long)GFLog + lVar7 + 0x60));
    auVar20 = vpmovzxwq_avx512f(*(undefined1 (*) [16])((long)GFLog + lVar7 + 0x40));
    auVar21 = vpmovzxwq_avx512f(*(undefined1 (*) [16])((long)GFLog + lVar7 + 0x20));
    auVar22 = vpmovzxwq_avx512f(*(undefined1 (*) [16])((long)GFLog + lVar7));
    auVar18 = vpinsrw_avx(ZEXT216(GFExp[auVar19._0_4_]),(uint)GFExp[auVar19._8_4_],1);
    auVar18 = vpinsrw_avx(auVar18,(uint)GFExp[auVar19._16_4_],2);
    auVar13 = vextracti32x4_avx512f(auVar19,2);
    auVar18 = vpinsrw_avx(auVar18,(uint)GFExp[auVar19._24_4_],3);
    auVar18 = vpinsrw_avx(auVar18,(uint)GFExp[auVar13._0_4_],4);
    auVar14 = vextracti32x4_avx512f(auVar19,3);
    auVar18 = vpinsrw_avx(auVar18,(uint)GFExp[auVar13._8_4_],5);
    auVar18 = vpinsrw_avx(auVar18,(uint)GFExp[auVar14._0_4_],6);
    auVar18 = vpinsrw_avx(auVar18,(uint)GFExp[auVar14._8_4_],7);
    auVar13 = vpinsrw_avx(ZEXT216(GFExp[auVar20._0_4_]),(uint)GFExp[auVar20._8_4_],1);
    auVar13 = vpinsrw_avx(auVar13,(uint)GFExp[auVar20._16_4_],2);
    auVar14 = vextracti32x4_avx512f(auVar20,2);
    auVar13 = vpinsrw_avx(auVar13,(uint)GFExp[auVar20._24_4_],3);
    auVar13 = vpinsrw_avx(auVar13,(uint)GFExp[auVar14._0_4_],4);
    auVar15 = vextracti32x4_avx512f(auVar20,3);
    auVar13 = vpinsrw_avx(auVar13,(uint)GFExp[auVar14._8_4_],5);
    auVar13 = vpinsrw_avx(auVar13,(uint)GFExp[auVar15._0_4_],6);
    auVar13 = vpinsrw_avx(auVar13,(uint)GFExp[auVar15._8_4_],7);
    auVar14 = vpinsrw_avx(ZEXT216(GFExp[auVar21._0_4_]),(uint)GFExp[auVar21._8_4_],1);
    auVar14 = vpinsrw_avx(auVar14,(uint)GFExp[auVar21._16_4_],2);
    auVar15 = vextracti32x4_avx512f(auVar21,2);
    auVar14 = vpinsrw_avx(auVar14,(uint)GFExp[auVar21._24_4_],3);
    auVar14 = vpinsrw_avx(auVar14,(uint)GFExp[auVar15._0_4_],4);
    auVar16 = vextracti32x4_avx512f(auVar21,3);
    auVar14 = vpinsrw_avx(auVar14,(uint)GFExp[auVar15._8_4_],5);
    auVar14 = vpinsrw_avx(auVar14,(uint)GFExp[auVar16._0_4_],6);
    auVar14 = vpinsrw_avx(auVar14,(uint)GFExp[auVar16._8_4_],7);
    auVar15 = vpinsrw_avx(ZEXT216(GFExp[auVar22._0_4_]),(uint)GFExp[auVar22._8_4_],1);
    auVar15 = vpinsrw_avx(auVar15,(uint)GFExp[auVar22._16_4_],2);
    auVar16 = vextracti32x4_avx512f(auVar22,2);
    auVar15 = vpinsrw_avx(auVar15,(uint)GFExp[auVar22._24_4_],3);
    auVar15 = vpinsrw_avx(auVar15,(uint)GFExp[auVar16._0_4_],4);
    auVar17 = vextracti32x4_avx512f(auVar22,3);
    auVar15 = vpinsrw_avx(auVar15,(uint)GFExp[auVar16._8_4_],5);
    auVar15 = vpinsrw_avx(auVar15,(uint)GFExp[auVar17._0_4_],6);
    auVar15 = vpinsrw_avx(auVar15,(uint)GFExp[auVar17._8_4_],7);
    auVar23._0_16_ = ZEXT116(0) * auVar18 + ZEXT116(1) * auVar13;
    auVar23._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar18;
    auVar19 = vinserti64x4_avx512f
                        (ZEXT3264(CONCAT1616(ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                                             ZEXT116(1) * auVar14,
                                             ZEXT116(0) * auVar14 + ZEXT116(1) * auVar15)),auVar23,1
                        );
    auVar19 = vmovdqu64_avx512f(auVar19);
    *(undefined1 (*) [64])((long)GFLog + lVar7) = auVar19;
    lVar7 = lVar7 + 0x40;
  } while (lVar7 != 0x20000);
  lVar7 = -0x10000;
  do {
    auVar19 = vpmovzxwq_avx512f(*(undefined1 (*) [16])pfVar3);
    auVar18 = vextracti32x4_avx512f(auVar19,2);
    lVar12 = CONCAT44((int)((ulong)lVar12 >> 0x20),auVar18._0_4_);
    auVar13 = vextracti32x4_avx512f(auVar19,3);
    lVar11 = CONCAT44((int)((ulong)lVar11 >> 0x20),auVar13._0_4_);
    fVar4 = (ffe_t)lVar7;
    GFExp[auVar19._0_4_] = fVar4;
    GFExp[auVar19._8_4_] = fVar4 + 1;
    GFExp[auVar19._16_4_] = fVar4 + 2;
    GFExp[auVar19._24_4_] = fVar4 + 3;
    GFExp[lVar12] = fVar4 + 4;
    GFExp[auVar18._8_4_] = fVar4 + 5;
    GFExp[lVar11] = fVar4 + 6;
    GFExp[auVar13._8_4_] = fVar4 + 7;
    pfVar3 = (ffe_t *)((long)pfVar3 + 0x10);
    lVar7 = lVar7 + 8;
  } while (lVar7 != 0);
  GFExp[0xffff] = GFExp[0];
  local_58 = vmovdqu16_avx512vl(_DAT_001032c0);
  lVar12 = 1;
  uVar5 = 0;
  do {
    uVar6 = ~(-1 << ((uint)uVar5 & 0x1f));
    uVar10 = (ulong)uVar6;
    skewVec[uVar10] = 0;
    uVar9 = uVar5;
    do {
      uVar8 = 2 << ((uint)uVar9 & 0x1f);
      if (uVar6 < uVar8) {
        uVar1 = *(ushort *)(local_58 + uVar9 * 2);
        lVar7 = 0;
        do {
          skewVec[lVar7 + uVar10 + uVar8] = skewVec[lVar7 + uVar10] ^ uVar1;
          lVar7 = lVar7 + (ulong)(uint)(2 << ((uint)uVar5 & 0x1f));
        } while (uVar10 + lVar7 < (ulong)uVar8);
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != 0xf);
    uVar1 = *(ushort *)(local_58 + uVar5 * 2);
    if ((ulong)uVar1 == 0) {
      uVar9 = 0;
    }
    else {
      uVar9 = (ulong)GFExp[((uint)GFLog[uVar1] + (uint)GFLog[uVar1 ^ 1] >> 0x10) +
                           (uint)GFLog[uVar1] + (uint)GFLog[uVar1 ^ 1] & 0xffff];
    }
    *(ffe_t *)(local_58 + uVar5 * 2) = ~GFLog[uVar9];
    lVar7 = lVar12;
    if (uVar5 < 0xe) {
      do {
        uVar1 = *(ushort *)(local_58 + lVar7 * 2);
        if ((ulong)uVar1 == 0) {
          fVar4 = 0;
        }
        else {
          uVar6 = (((uint)GFLog[uVar1 ^ 1] + (uint)*(ushort *)(local_58 + uVar5 * 2) >> 0x10) +
                   (uint)GFLog[uVar1 ^ 1] + (uint)*(ushort *)(local_58 + uVar5 * 2) & 0xffff) +
                  (uint)GFLog[uVar1];
          fVar4 = GFExp[(uVar6 >> 0x10) + uVar6 & 0xffff];
        }
        *(ffe_t *)(local_58 + lVar7 * 2) = fVar4;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 0xf);
    }
    uVar5 = uVar5 + 1;
    lVar12 = lVar12 + 1;
  } while (uVar5 != 0xf);
  lVar12 = 0;
  do {
    auVar19 = vpmovzxwq_avx512f(*(undefined1 (*) [16])((long)skewVec + lVar12 + 0x60));
    auVar20 = vpmovzxwq_avx512f(*(undefined1 (*) [16])((long)skewVec + lVar12 + 0x40));
    auVar21 = vpmovzxwq_avx512f(*(undefined1 (*) [16])((long)skewVec + lVar12 + 0x20));
    auVar22 = vpmovzxwq_avx512f(*(undefined1 (*) [16])((long)skewVec + lVar12));
    auVar18 = vpinsrw_avx(ZEXT216(GFLog[auVar19._0_4_]),(uint)GFLog[auVar19._8_4_],1);
    auVar18 = vpinsrw_avx(auVar18,(uint)GFLog[auVar19._16_4_],2);
    auVar13 = vextracti32x4_avx512f(auVar19,2);
    auVar18 = vpinsrw_avx(auVar18,(uint)GFLog[auVar19._24_4_],3);
    auVar18 = vpinsrw_avx(auVar18,(uint)GFLog[auVar13._0_4_],4);
    auVar14 = vextracti32x4_avx512f(auVar19,3);
    auVar18 = vpinsrw_avx(auVar18,(uint)GFLog[auVar13._8_4_],5);
    auVar18 = vpinsrw_avx(auVar18,(uint)GFLog[auVar14._0_4_],6);
    auVar18 = vpinsrw_avx(auVar18,(uint)GFLog[auVar14._8_4_],7);
    auVar13 = vpinsrw_avx(ZEXT216(GFLog[auVar20._0_4_]),(uint)GFLog[auVar20._8_4_],1);
    auVar13 = vpinsrw_avx(auVar13,(uint)GFLog[auVar20._16_4_],2);
    auVar14 = vextracti32x4_avx512f(auVar20,2);
    auVar13 = vpinsrw_avx(auVar13,(uint)GFLog[auVar20._24_4_],3);
    auVar13 = vpinsrw_avx(auVar13,(uint)GFLog[auVar14._0_4_],4);
    auVar15 = vextracti32x4_avx512f(auVar20,3);
    auVar13 = vpinsrw_avx(auVar13,(uint)GFLog[auVar14._8_4_],5);
    auVar13 = vpinsrw_avx(auVar13,(uint)GFLog[auVar15._0_4_],6);
    auVar13 = vpinsrw_avx(auVar13,(uint)GFLog[auVar15._8_4_],7);
    auVar14 = vpinsrw_avx(ZEXT216(GFLog[auVar21._0_4_]),(uint)GFLog[auVar21._8_4_],1);
    auVar14 = vpinsrw_avx(auVar14,(uint)GFLog[auVar21._16_4_],2);
    auVar15 = vextracti32x4_avx512f(auVar21,2);
    auVar14 = vpinsrw_avx(auVar14,(uint)GFLog[auVar21._24_4_],3);
    auVar14 = vpinsrw_avx(auVar14,(uint)GFLog[auVar15._0_4_],4);
    auVar16 = vextracti32x4_avx512f(auVar21,3);
    auVar14 = vpinsrw_avx(auVar14,(uint)GFLog[auVar15._8_4_],5);
    auVar14 = vpinsrw_avx(auVar14,(uint)GFLog[auVar16._0_4_],6);
    auVar14 = vpinsrw_avx(auVar14,(uint)GFLog[auVar16._8_4_],7);
    auVar15 = vpinsrw_avx(ZEXT216(GFLog[auVar22._0_4_]),(uint)GFLog[auVar22._8_4_],1);
    auVar15 = vpinsrw_avx(auVar15,(uint)GFLog[auVar22._16_4_],2);
    auVar16 = vextracti32x4_avx512f(auVar22,2);
    auVar15 = vpinsrw_avx(auVar15,(uint)GFLog[auVar22._24_4_],3);
    auVar15 = vpinsrw_avx(auVar15,(uint)GFLog[auVar16._0_4_],4);
    auVar17 = vextracti32x4_avx512f(auVar22,3);
    auVar15 = vpinsrw_avx(auVar15,(uint)GFLog[auVar16._8_4_],5);
    auVar15 = vpinsrw_avx(auVar15,(uint)GFLog[auVar17._0_4_],6);
    auVar15 = vpinsrw_avx(auVar15,(uint)GFLog[auVar17._8_4_],7);
    auVar24._0_16_ = ZEXT116(0) * auVar18 + ZEXT116(1) * auVar13;
    auVar24._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar18;
    auVar19 = vinserti64x4_avx512f
                        (ZEXT3264(CONCAT1616(ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                                             ZEXT116(1) * auVar14,
                                             ZEXT116(0) * auVar14 + ZEXT116(1) * auVar15)),auVar24,1
                        );
    auVar19 = vmovdqu64_avx512f(auVar19);
    *(undefined1 (*) [64])((long)skewVec + lVar12) = auVar19;
    lVar12 = lVar12 + 0x40;
  } while (lVar12 != 0x20000);
  uVar6 = 0x125090;
  memcpy(log_walsh,GFLog,0x20000);
  log_walsh[0] = 0;
  FWHT(log_walsh,uVar6);
  uVar5 = time((time_t *)0x0);
  do {
    test(0x8000,0x8000,(uint)uVar5);
    uVar5 = (ulong)((uint)uVar5 + 1);
  } while( true );
}

Assistant:

int main(int argc, char **argv)
{
    // Fill GFLog table and GFExp table
    InitField();

    // Compute factors used in erasure decoder
    InitFieldOperations();

    unsigned seed = (unsigned)time(NULL);
    for (;;)
    {
#ifdef LEO_SHORT_FIELD
        const unsigned input_count = 32;
        const unsigned recovery_count = 16;
#else // LEO_SHORT_FIELD
        const unsigned input_count = 32768;
        const unsigned recovery_count = 32768;
#endif // LEO_SHORT_FIELD

        test(input_count, recovery_count, seed);

        ++seed;
    }

    return 0;
}